

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::SkelRoot>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,SkelRoot *root,
               string *warn,string *err,PrimReconstructOptions *options)

{
  _Rb_tree_node_base *p_Var1;
  size_type *psVar2;
  size_type *psVar3;
  size_type *psVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Rb_tree_header *p_Var6;
  uint uVar7;
  bool bVar8;
  int iVar9;
  undefined7 extraout_var;
  ostream *poVar10;
  long *plVar11;
  const_iterator cVar12;
  mapped_type *pmVar13;
  _Rb_tree_node_base *p_Var14;
  Property *prop;
  char *pcVar15;
  char *pcVar16;
  _Rb_tree_header *p_Var17;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_w;
  undefined1 local_300 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2e8;
  string *local_2d8;
  string *local_2d0;
  _Rb_tree_node_base *local_2c8;
  string local_2c0;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_2a0;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_298;
  undefined8 local_290;
  long *local_288 [2];
  long local_278 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_268;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *local_260;
  Property *local_258;
  _Rb_tree_node_base *local_250;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  undefined1 local_218 [16];
  code *local_208;
  code *pcStack_200;
  ios_base local_1a8 [272];
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  p_Var6 = &local_248._M_impl.super__Rb_tree_header;
  local_248._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_248._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_290 = 0;
  local_248._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2d8 = warn;
  local_2d0 = err;
  local_248._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
  local_248._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
  bVar8 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_248,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)root,err);
  if (bVar8) {
    p_Var14 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var17 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    local_290 = CONCAT71(extraout_var,(_Rb_tree_header *)p_Var14 == p_Var17);
    if ((_Rb_tree_header *)p_Var14 != p_Var17) {
      local_260 = &root->extent;
      local_268 = &root->props;
      local_2a0 = &root->purpose;
      local_298 = &root->visibility;
      do {
        p_Var1 = p_Var14 + 1;
        iVar9 = ::std::__cxx11::string::compare((char *)p_Var1);
        if (iVar9 == 0) {
          local_218._0_8_ = &local_208;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"visibility","");
          cVar12 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_248,(key_type *)local_218);
          if ((code **)local_218._0_8_ != &local_208) {
            operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
          }
          iVar9 = 3;
          if ((_Rb_tree_header *)cVar12._M_node == p_Var6) {
            if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
              local_218._0_8_ = &local_208;
              local_218._8_8_ = 0;
              local_208 = (code *)((ulong)local_208 & 0xffffffffffffff00);
            }
            else {
              Attribute::type_name_abi_cxx11_((string *)local_218,(Attribute *)(p_Var14 + 2));
            }
            local_300._0_8_ = local_300 + 0x10;
            local_300._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x5;
            local_300._16_6_ = 0x6e656b6f74;
            if (((local_218._8_8_ == 5) &&
                (iVar9 = bcmp((void *)local_218._0_8_,local_300 + 0x10,5), iVar9 == 0)) &&
               (uVar7 = *(uint *)((long)&p_Var14[0x17]._M_parent + 4), uVar7 < 2)) {
              if ((code **)local_218._0_8_ != &local_208) {
                operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
              }
              if (uVar7 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
                poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0xb37);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"No value assigned to `",0x16);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"visibility",10);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"` token attribute. Set default token value.",0x2b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\n",1);
                if (local_2d8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar11 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_2c0,
                                               (ulong)(local_2d0->_M_dataplus)._M_p);
                  psVar3 = (size_type *)(plVar11 + 2);
                  if ((size_type *)*plVar11 == psVar3) {
                    local_300._16_8_ = *psVar3;
                    aStack_2e8._M_allocated_capacity = plVar11[3];
                    local_300._0_8_ = local_300 + 0x10;
                  }
                  else {
                    local_300._16_8_ = *psVar3;
                    local_300._0_8_ = (size_type *)*plVar11;
                  }
                  local_300._8_8_ = plVar11[1];
                  *plVar11 = (long)psVar3;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_2d8,(string *)local_300);
                  if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
                    operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                    operator_delete(local_2c0._M_dataplus._M_p,
                                    local_2c0.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
                ::std::ios_base::~ios_base(local_1a8);
                AttrMetas::operator=(&local_298->_metas,(AttrMetas *)(p_Var14 + 7));
                pcVar16 = "visibility";
                pcVar15 = "";
LAB_001f150f:
                iVar9 = 3;
                local_218._0_8_ = &local_208;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_218,pcVar16,pcVar15);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_248,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_218);
                if ((code **)local_218._0_8_ != &local_208) {
                  operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
                }
                goto LAB_001f136c;
              }
            }
            else if ((code **)local_218._0_8_ != &local_208) {
              operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
            }
            local_300._0_8_ = local_300 + 0x10;
            local_218._8_8_ = 0;
            local_218._0_8_ = VisibilityEnumHandler;
            pcStack_200 = ::std::
                          _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          ::_M_invoke;
            local_208 = ::std::
                        _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        ::_M_manager;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"visibility","");
            bVar8 = options->strict_allowedToken_check;
            local_48 = (code *)0x0;
            pcStack_40 = (code *)0x0;
            local_58._M_unused._M_object = (void *)0x0;
            local_58._8_8_ = 0;
            if (local_208 != (code *)0x0) {
              (*local_208)(&local_58,local_218,2);
              local_48 = local_208;
              pcStack_40 = pcStack_200;
            }
            bVar8 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                              ((string *)local_300,bVar8,
                               (EnumHandlerFun<tinyusdz::Visibility> *)&local_58,
                               (Attribute *)(p_Var14 + 2),local_298,local_2d8,local_2d0);
            if (local_48 != (code *)0x0) {
              (*local_48)(&local_58,&local_58,__destroy_functor);
            }
            if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
              operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
            }
            iVar9 = 1;
            if (bVar8) {
              AttrMetas::operator=(&local_298->_metas,(AttrMetas *)(p_Var14 + 7));
              pcVar16 = "visibility";
              pcVar15 = "";
LAB_001f0ede:
              local_300._0_8_ = local_300 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_300,pcVar16,pcVar15)
              ;
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_248,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_300);
              if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
                operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
              }
              iVar9 = 3;
            }
            goto LAB_001f0f10;
          }
        }
        else {
          iVar9 = ::std::__cxx11::string::compare((char *)p_Var1);
          if (iVar9 == 0) {
            local_218._0_8_ = &local_208;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"purpose","");
            cVar12 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_248,(key_type *)local_218);
            if ((code **)local_218._0_8_ != &local_208) {
              operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
            }
            iVar9 = 3;
            if ((_Rb_tree_header *)cVar12._M_node != p_Var6) goto LAB_001f136c;
            if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
              local_218._0_8_ = &local_208;
              local_218._8_8_ = 0;
              local_208 = (code *)((ulong)local_208 & 0xffffffffffffff00);
            }
            else {
              Attribute::type_name_abi_cxx11_((string *)local_218,(Attribute *)(p_Var14 + 2));
            }
            local_300._0_8_ = local_300 + 0x10;
            local_300._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x5;
            local_300._16_6_ = 0x6e656b6f74;
            if (((local_218._8_8_ == 5) &&
                (iVar9 = bcmp((void *)local_218._0_8_,local_300 + 0x10,5), iVar9 == 0)) &&
               (uVar7 = *(uint *)((long)&p_Var14[0x17]._M_parent + 4), uVar7 < 2)) {
              if ((code **)local_218._0_8_ != &local_208) {
                operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
              }
              if (uVar7 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
                poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0xb39);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"No value assigned to `",0x16);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"purpose",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"` token attribute. Set default token value.",0x2b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\n",1);
                if (local_2d8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar11 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_2c0,
                                               (ulong)(local_2d0->_M_dataplus)._M_p);
                  psVar3 = (size_type *)(plVar11 + 2);
                  if ((size_type *)*plVar11 == psVar3) {
                    local_300._16_8_ = *psVar3;
                    aStack_2e8._M_allocated_capacity = plVar11[3];
                    local_300._0_8_ = local_300 + 0x10;
                  }
                  else {
                    local_300._16_8_ = *psVar3;
                    local_300._0_8_ = (size_type *)*plVar11;
                  }
                  local_300._8_8_ = plVar11[1];
                  *plVar11 = (long)psVar3;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_2d8,(string *)local_300);
                  if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
                    operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                    operator_delete(local_2c0._M_dataplus._M_p,
                                    local_2c0.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
                ::std::ios_base::~ios_base(local_1a8);
                AttrMetas::operator=(&local_2a0->_metas,(AttrMetas *)(p_Var14 + 7));
                pcVar16 = "purpose";
                pcVar15 = "";
                goto LAB_001f150f;
              }
            }
            else if ((code **)local_218._0_8_ != &local_208) {
              operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
            }
            local_300._0_8_ = local_300 + 0x10;
            local_218._8_8_ = 0;
            local_218._0_8_ = PurposeEnumHandler;
            pcStack_200 = ::std::
                          _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          ::_M_invoke;
            local_208 = ::std::
                        _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        ::_M_manager;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"purpose","");
            bVar8 = options->strict_allowedToken_check;
            local_68 = (code *)0x0;
            pcStack_60 = (code *)0x0;
            local_78._M_unused._M_object = (void *)0x0;
            local_78._8_8_ = 0;
            if (local_208 != (code *)0x0) {
              (*local_208)(&local_78,local_218,2);
              local_68 = local_208;
              pcStack_60 = pcStack_200;
            }
            bVar8 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                              ((string *)local_300,bVar8,
                               (EnumHandlerFun<tinyusdz::Purpose> *)&local_78,
                               (Attribute *)(p_Var14 + 2),local_2a0,local_2d8,local_2d0);
            if (local_68 != (code *)0x0) {
              (*local_68)(&local_78,&local_78,__destroy_functor);
            }
            if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
              operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
            }
            iVar9 = 1;
            if (bVar8) {
              AttrMetas::operator=(&local_2a0->_metas,(AttrMetas *)(p_Var14 + 7));
              pcVar16 = "purpose";
              pcVar15 = "";
              goto LAB_001f0ede;
            }
LAB_001f0f10:
            if (local_208 != (code *)0x0) {
              (*local_208)(local_218,local_218,3);
            }
          }
          else {
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            local_250 = p_Var1;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,*(long *)(p_Var14 + 1),
                       (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
            prop = (Property *)(p_Var14 + 2);
            local_2c8 = p_Var14;
            local_218._0_8_ = &local_208;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"extent","");
            local_258 = prop;
            anon_unknown_0::ParseExtentAttribute
                      ((ParseResult *)local_300,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_248,&local_98,prop,(string *)local_218,local_260);
            if ((code **)local_218._0_8_ != &local_208) {
              operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            p_Var1 = local_250;
            p_Var14 = local_2c8;
            iVar9 = 0;
            if ((local_300._0_8_ & 0xfffffffd) == 0) {
              iVar9 = 3;
LAB_001f0fca:
              bVar8 = false;
            }
            else {
              bVar8 = true;
              if (local_300._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
                poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0xb3a);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                local_288[0] = local_278;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_288,"Parsing attribute `extent` failed. Error: {}","");
                fmt::format<std::__cxx11::string>
                          (&local_2c0,(fmt *)local_288,(string *)(local_300 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop
                          );
                poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_218,local_2c0._M_dataplus._M_p,
                                     local_2c0._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                paVar5 = &local_2c0.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c0._M_dataplus._M_p != paVar5) {
                  operator_delete(local_2c0._M_dataplus._M_p,
                                  local_2c0.field_2._M_allocated_capacity + 1);
                }
                if (local_288[0] != local_278) {
                  operator_delete(local_288[0],local_278[0] + 1);
                }
                if (local_2d0 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar11 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)local_288,
                                               (ulong)(local_2d0->_M_dataplus)._M_p);
                  psVar2 = (size_type *)(plVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar11 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar2) {
                    local_2c0.field_2._M_allocated_capacity = *psVar2;
                    local_2c0.field_2._8_8_ = plVar11[3];
                    local_2c0._M_dataplus._M_p = (pointer)paVar5;
                  }
                  else {
                    local_2c0.field_2._M_allocated_capacity = *psVar2;
                    local_2c0._M_dataplus._M_p = (pointer)*plVar11;
                  }
                  local_2c0._M_string_length = plVar11[1];
                  *plVar11 = (long)psVar2;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_2d0,(string *)&local_2c0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c0._M_dataplus._M_p != paVar5) {
                    operator_delete(local_2c0._M_dataplus._M_p,
                                    local_2c0.field_2._M_allocated_capacity + 1);
                  }
                  if (local_288[0] != local_278) {
                    operator_delete(local_288[0],local_278[0] + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
                ::std::ios_base::~ios_base(local_1a8);
                iVar9 = 1;
                goto LAB_001f0fca;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_300._8_8_ != &aStack_2e8) {
              operator_delete((void *)local_300._8_8_,aStack_2e8._M_allocated_capacity + 1);
            }
            if (bVar8) {
              cVar12 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_248,(key_type *)p_Var1);
              if ((_Rb_tree_header *)cVar12._M_node == p_Var6) {
                pmVar13 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          ::operator[](local_268,(key_type *)p_Var1);
                ::std::__cxx11::string::_M_assign((string *)pmVar13);
                (pmVar13->_attrib)._varying_authored = (bool)p_Var14[3].field_0x4;
                (pmVar13->_attrib)._variability = p_Var14[3]._M_color;
                ::std::__cxx11::string::_M_assign((string *)&(pmVar13->_attrib)._type_name);
                linb::any::operator=((any *)&(pmVar13->_attrib)._var,(any *)&local_2c8[4]._M_parent)
                ;
                (pmVar13->_attrib)._var._blocked = SUB41(local_2c8[5]._M_color,0);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&(pmVar13->_attrib)._var._ts,
                            (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&local_2c8[5]._M_parent);
                p_Var14 = local_2c8;
                (pmVar13->_attrib)._var._ts._dirty = SUB41(local_2c8[6]._M_color,0);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&(pmVar13->_attrib)._paths,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &local_2c8[6]._M_parent);
                AttrMetas::operator=(&(pmVar13->_attrib)._metas,(AttrMetas *)(p_Var14 + 7));
                *(_Base_ptr *)&pmVar13->_listOpQual = p_Var14[0x17]._M_parent;
                (pmVar13->_rel).type = *(Type *)&p_Var14[0x17]._M_left;
                Path::operator=(&(pmVar13->_rel).targetPath,(Path *)&p_Var14[0x17]._M_right);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&(pmVar13->_rel).targetPathVector,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var14[0x1e]._M_parent);
                (pmVar13->_rel).listOpQual = p_Var14[0x1f]._M_color;
                AttrMetas::operator=(&(pmVar13->_rel)._metas,(AttrMetas *)&p_Var14[0x1f]._M_parent);
                (pmVar13->_rel)._varying_authored = *(bool *)&p_Var14[0x2f]._M_left;
                ::std::__cxx11::string::_M_assign((string *)&pmVar13->_prop_value_type_name);
                pmVar13->_has_custom = *(bool *)&p_Var14[0x30]._M_right;
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_248,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var1);
              }
              cVar12 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_248,(key_type *)p_Var1);
              iVar9 = 0;
              if ((_Rb_tree_header *)cVar12._M_node == p_Var6) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
                poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0xb3c);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_300,"Unsupported/unimplemented property: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)p_Var1);
                poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_218,(char *)local_300._0_8_,local_300._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                psVar3 = (size_type *)(local_300 + 0x10);
                if ((size_type *)local_300._0_8_ != psVar3) {
                  operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
                }
                if (local_2d8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar11 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_2c0,
                                               (ulong)(local_2d0->_M_dataplus)._M_p);
                  psVar4 = (size_type *)(plVar11 + 2);
                  if ((size_type *)*plVar11 == psVar4) {
                    local_300._16_8_ = *psVar4;
                    aStack_2e8._M_allocated_capacity = plVar11[3];
                    local_300._0_8_ = psVar3;
                  }
                  else {
                    local_300._16_8_ = *psVar4;
                    local_300._0_8_ = (size_type *)*plVar11;
                  }
                  local_300._8_8_ = plVar11[1];
                  *plVar11 = (long)psVar4;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_2d8,(string *)local_300);
                  if ((size_type *)local_300._0_8_ != psVar3) {
                    operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                    operator_delete(local_2c0._M_dataplus._M_p,
                                    local_2c0.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
                ::std::ios_base::~ios_base(local_1a8);
                iVar9 = 0;
              }
            }
          }
        }
LAB_001f136c:
        if ((iVar9 != 3) && (iVar9 != 0)) break;
        p_Var14 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var14);
        local_290 = CONCAT71((int7)((ulong)p_Var14 >> 8),(_Rb_tree_header *)p_Var14 == p_Var17);
      } while ((_Rb_tree_header *)p_Var14 != p_Var17);
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_248,(_Link_type)local_248._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)((byte)local_290 & 1);
}

Assistant:

bool ReconstructPrim<SkelRoot>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    SkelRoot *root,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &root->xformOps, err)) {
    return false;
  }

  // SkelRoot is something like a grouping node, having 1 Skeleton and possibly?
  // multiple Prim hierarchy containing GeomMesh.
  // No specific properties for SkelRoot(AFAIK)

  // custom props only
  for (const auto &prop : properties) {
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, SkelRoot,
                   root->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, SkelRoot,
                       root->purpose, options.strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, SkelRoot, root->extent)
    ADD_PROPERTY(table, prop, SkelRoot, root->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}